

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  byte *pbVar1;
  char cVar2;
  Ch *pCVar3;
  char *pcVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  byte *pbVar11;
  _func_int **pp_Var12;
  long lVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  BaseState<false> *pBVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 extraout_var_00;
  undefined4 extraout_var_04;
  
  bVar17 = *is->src_;
  if (bVar17 < 0x6e) {
    if (bVar17 == 0x22) {
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                (this,is,handler,false);
      return;
    }
    if (bVar17 == 0x66) {
      pCVar3 = is->src_;
      is->src_ = pCVar3 + 1;
      if ((((pCVar3[1] == 'a') && (is->src_ = pCVar3 + 2, pCVar3[2] == 'l')) &&
          (is->src_ = pCVar3 + 3, pCVar3[3] == 's')) && (is->src_ = pCVar3 + 4, pCVar3[4] == 'e')) {
        is->src_ = pCVar3 + 5;
        pBVar14 = (handler->ctx).current_state;
        iVar9 = (*pBVar14->_vptr_BaseState[1])(pBVar14,handler,0);
        if ((BaseState<false> *)CONCAT44(extraout_var_03,iVar9) != (BaseState<false> *)0x0) {
          (handler->ctx).previous_state = (handler->ctx).current_state;
          (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_03,iVar9);
          return;
        }
        lVar13 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 0x10;
      }
      else {
        lVar13 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 3;
      }
      *(long *)(this + 0x38) = lVar13;
      return;
    }
    if (bVar17 != 0x5b) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                (this,is,handler);
      return;
    }
    is->src_ = is->src_ + 1;
    pBVar14 = (handler->ctx).current_state;
    iVar9 = (*pBVar14->_vptr_BaseState[8])(pBVar14,handler);
    if ((BaseState<false> *)CONCAT44(extraout_var,iVar9) != (BaseState<false> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var,iVar9);
      pbVar11 = (byte *)is->src_;
      while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))) {
        pbVar11 = pbVar11 + 1;
      }
      is->src_ = (Ch *)pbVar11;
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*pbVar11 == 0x5d) {
        is->src_ = (Ch *)(pbVar11 + 1);
        pBVar14 = (handler->ctx).current_state;
        pp_Var12 = pBVar14->_vptr_BaseState;
        uVar22 = 0;
      }
      else {
        uVar16 = 0;
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar11 = (byte *)is->src_;
          while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0)))
          {
            pbVar11 = pbVar11 + 1;
          }
          is->src_ = (Ch *)pbVar11;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          uVar16 = uVar16 + 1;
          if (*pbVar11 != 0x2c) break;
          pbVar11 = pbVar11 + 1;
          is->src_ = (Ch *)pbVar11;
          while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0)))
          {
            pbVar11 = pbVar11 + 1;
          }
          is->src_ = (Ch *)pbVar11;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*is->src_ != ']') {
          lVar13 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_00115ea1;
        }
        is->src_ = is->src_ + 1;
        pBVar14 = (handler->ctx).current_state;
        pp_Var12 = pBVar14->_vptr_BaseState;
        uVar22 = (ulong)uVar16;
      }
      iVar9 = (*pp_Var12[9])(pBVar14,handler,uVar22);
      if ((BaseState<false> *)CONCAT44(extraout_var_00,iVar9) != (BaseState<false> *)0x0) {
        (handler->ctx).previous_state = (handler->ctx).current_state;
        (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_00,iVar9);
        return;
      }
    }
    lVar13 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_00115ea1:
    *(long *)(this + 0x38) = lVar13;
    return;
  }
  if (bVar17 == 0x6e) {
    pCVar3 = is->src_;
    is->src_ = pCVar3 + 1;
    if (((pCVar3[1] == 'u') && (is->src_ = pCVar3 + 2, pCVar3[2] == 'l')) &&
       (is->src_ = pCVar3 + 3, pCVar3[3] == 'l')) {
      is->src_ = pCVar3 + 4;
      pBVar14 = (handler->ctx).current_state;
      iVar9 = (**pBVar14->_vptr_BaseState)(pBVar14,handler);
      if ((BaseState<false> *)CONCAT44(extraout_var_01,iVar9) != (BaseState<false> *)0x0) {
        (handler->ctx).previous_state = (handler->ctx).current_state;
        (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_01,iVar9);
        return;
      }
      lVar13 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
    }
    else {
      lVar13 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 3;
    }
    *(long *)(this + 0x38) = lVar13;
    return;
  }
  if (bVar17 == 0x74) {
    pCVar3 = is->src_;
    is->src_ = pCVar3 + 1;
    if (((pCVar3[1] == 'r') && (is->src_ = pCVar3 + 2, pCVar3[2] == 'u')) &&
       (is->src_ = pCVar3 + 3, pCVar3[3] == 'e')) {
      is->src_ = pCVar3 + 4;
      pBVar14 = (handler->ctx).current_state;
      iVar9 = (*pBVar14->_vptr_BaseState[1])(pBVar14,handler,1);
      if ((BaseState<false> *)CONCAT44(extraout_var_02,iVar9) != (BaseState<false> *)0x0) {
        (handler->ctx).previous_state = (handler->ctx).current_state;
        (handler->ctx).current_state = (BaseState<false> *)CONCAT44(extraout_var_02,iVar9);
        return;
      }
      lVar13 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
    }
    else {
      lVar13 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 3;
    }
    *(long *)(this + 0x38) = lVar13;
    return;
  }
  if (bVar17 == 0x7b) {
    ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
              (this,is,handler);
    return;
  }
  pcVar4 = is->src_;
  pCVar3 = is->dst_;
  pCVar5 = is->head_;
  cVar2 = *pcVar4;
  pbVar11 = (byte *)(pcVar4 + (cVar2 == '-'));
  bVar17 = pcVar4[cVar2 == '-'];
  if (bVar17 == 0x30) {
    pbVar11 = pbVar11 + 1;
    uVar22 = 0;
    bVar6 = false;
    iVar9 = 0;
    uVar15 = 0;
LAB_001db226:
    dVar24 = 0.0;
    if (bVar6) {
      bVar17 = *pbVar11;
      bVar20 = bVar17 - 0x30;
      if (cVar2 == '-') {
        while (bVar20 < 10) {
          if ((0xccccccccccccccb < uVar22) && (uVar22 != 0xccccccccccccccc || '8' < (char)bVar17))
          goto LAB_001db303;
          uVar22 = (ulong)(bVar17 & 0xf) + uVar22 * 10;
          iVar9 = iVar9 + 1;
          bVar17 = pbVar11[1];
          pbVar11 = pbVar11 + 1;
          bVar20 = bVar17 - 0x30;
        }
      }
      else {
        while (bVar20 < 10) {
          if ((0x1999999999999998 < uVar22) && (uVar22 != 0x1999999999999999 || '5' < (char)bVar17))
          goto LAB_001db303;
          uVar22 = (ulong)(bVar17 & 0xf) + uVar22 * 10;
          iVar9 = iVar9 + 1;
          bVar17 = pbVar11[1];
          pbVar11 = pbVar11 + 1;
          bVar20 = bVar17 - 0x30;
        }
      }
    }
    bVar7 = false;
    goto LAB_001db32c;
  }
  if ((byte)(bVar17 - 0x31) < 9) {
    uVar15 = (ulong)(bVar17 - 0x30);
    bVar17 = pbVar11[1];
    pbVar11 = pbVar11 + 1;
    if (cVar2 == '-') {
      if (9 < (byte)(bVar17 - 0x30)) {
LAB_001db80c:
        uVar22 = 0;
        bVar6 = false;
        iVar9 = 0;
        goto LAB_001db226;
      }
      iVar9 = 0;
      do {
        uVar16 = (uint)uVar15;
        if ((0xccccccb < uVar16) && ('8' < (char)bVar17 || uVar16 != 0xccccccc)) goto LAB_001db21e;
        uVar15 = (ulong)(((uint)bVar17 + uVar16 * 10) - 0x30);
        iVar9 = iVar9 + 1;
        bVar17 = pbVar11[1];
        pbVar11 = pbVar11 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    else {
      if (9 < (byte)(bVar17 - 0x30)) goto LAB_001db80c;
      iVar9 = 0;
      do {
        uVar16 = (uint)uVar15;
        if ((0x19999998 < uVar16) && ('5' < (char)bVar17 || uVar16 != 0x19999999))
        goto LAB_001db21e;
        uVar15 = (ulong)(((uint)bVar17 + uVar16 * 10) - 0x30);
        iVar9 = iVar9 + 1;
        bVar17 = pbVar11[1];
        pbVar11 = pbVar11 + 1;
      } while ((byte)(bVar17 - 0x30) < 10);
    }
    bVar6 = false;
    uVar22 = 0;
    goto LAB_001db226;
  }
  lVar13 = (long)pbVar11 - (long)pCVar5;
  uVar10 = 3;
  goto LAB_001db61d;
LAB_001db21e:
  bVar6 = true;
  uVar22 = uVar15;
  goto LAB_001db226;
LAB_001db303:
  auVar26._8_4_ = (int)(uVar22 >> 0x20);
  auVar26._0_8_ = uVar22;
  auVar26._12_4_ = 0x45300000;
  dVar24 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0);
  bVar7 = true;
LAB_001db32c:
  lVar13 = (long)pcVar4 - (long)pCVar5;
  if (bVar7) {
    bVar17 = *pbVar11;
    while ((byte)(bVar17 - 0x30) < 10) {
      if (1.7976931348623158e+307 <= dVar24) {
        uVar10 = 0xd;
        goto LAB_001db61d;
      }
      dVar24 = dVar24 * 10.0 + (double)((char)*pbVar11 + -0x30);
      bVar17 = pbVar11[1];
      pbVar11 = pbVar11 + 1;
    }
  }
  bVar17 = *pbVar11;
  pbVar11 = pbVar11 + (bVar17 == 0x2e);
  iVar21 = 0;
  if (bVar17 == 0x2e) {
    if ((byte)(*pbVar11 - 0x3a) < 0xf6) {
      lVar13 = (long)pbVar11 - (long)pCVar5;
      uVar10 = 0xe;
      goto LAB_001db61d;
    }
    iVar21 = 0;
    if (!bVar7) {
      uVar19 = uVar15;
      if (bVar6) {
        uVar19 = uVar22;
      }
      uVar22 = uVar19;
      bVar17 = *pbVar11;
      iVar21 = 0;
      if ((0xf5 < (byte)(bVar17 - 0x3a)) && (uVar22 < 0x20000000000000)) {
        lVar18 = 0;
        do {
          uVar22 = (ulong)(bVar17 & 0xf) + uVar22 * 10;
          iVar9 = (uint)(uVar22 != 0) + iVar9;
          bVar17 = pbVar11[lVar18 + 1];
          lVar18 = lVar18 + 1;
          if ((byte)(bVar17 - 0x3a) < 0xf6) break;
        } while (uVar22 < 0x20000000000000);
        iVar21 = -(int)lVar18;
        pbVar11 = pbVar11 + lVar18;
      }
      auVar27._8_4_ = (int)(uVar22 >> 0x20);
      auVar27._0_8_ = uVar22;
      auVar27._12_4_ = 0x45300000;
      dVar24 = (auVar27._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar17 = *pbVar11;
    while ((byte)(bVar17 - 0x30) < 10) {
      if (iVar9 < 0x11) {
        dVar24 = dVar24 * 10.0 + (double)(int)(bVar17 - 0x30);
        iVar21 = iVar21 + -1;
        if (0.0 < dVar24) {
          iVar9 = iVar9 + 1;
        }
      }
      pbVar1 = pbVar11 + 1;
      pbVar11 = pbVar11 + 1;
      bVar17 = *pbVar1;
    }
  }
  bVar17 = *pbVar11;
  pbVar11 = pbVar11 + (bVar17 == 0x65);
  if (bVar17 == 0x65) {
LAB_001db4eb:
    uVar19 = uVar15;
    if (bVar6) {
      uVar19 = uVar22;
    }
    if (!bVar7) {
      auVar28._8_4_ = (int)(uVar19 >> 0x20);
      auVar28._0_8_ = uVar19;
      auVar28._12_4_ = 0x45300000;
      dVar24 = (auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar17 = *pbVar11;
    pbVar11 = pbVar11 + (bVar17 == 0x2b);
    if (bVar17 == 0x2b) {
      bVar23 = false;
    }
    else {
      bVar23 = *pbVar11 == 0x2d;
      pbVar11 = pbVar11 + bVar23;
    }
    bVar17 = *pbVar11;
    if ((byte)(bVar17 - 0x30) < 10) {
      pbVar11 = pbVar11 + 1;
      iVar9 = bVar17 - 0x30;
      if (bVar23) {
        bVar17 = *pbVar11;
        while ((byte)(bVar17 - 0x30) < 10) {
          iVar9 = (uint)bVar17 + iVar9 * 10 + -0x30;
          if (iVar9 < 0xccccccc) {
            pbVar11 = pbVar11 + 1;
          }
          else {
            do {
              pbVar1 = pbVar11 + 1;
              pbVar11 = pbVar11 + 1;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
          bVar17 = *pbVar11;
        }
      }
      else {
        do {
          bVar17 = *pbVar11;
          bVar20 = bVar17 - 0x30;
          if (9 < bVar20) goto LAB_001db607;
          pbVar11 = pbVar11 + 1;
          iVar9 = (uint)bVar17 + iVar9 * 10 + -0x30;
        } while (iVar9 <= 0x134 - iVar21);
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar13;
LAB_001db607:
        if (bVar20 < 10) {
          bVar23 = false;
          goto LAB_001db645;
        }
      }
      iVar8 = -iVar9;
      if (!bVar23) {
        iVar8 = iVar9;
      }
      iVar9 = iVar8;
      bVar23 = true;
    }
    else {
      *(undefined4 *)(this + 0x30) = 0xf;
      *(long *)(this + 0x38) = (long)pbVar11 - (long)pCVar5;
      bVar23 = false;
      iVar9 = 0;
    }
LAB_001db645:
    if (!bVar23) goto LAB_001db774;
  }
  else {
    bVar17 = *pbVar11;
    pbVar11 = pbVar11 + (bVar17 == 0x45);
    iVar9 = 0;
    if (bVar17 == 0x45) goto LAB_001db4eb;
  }
  if (bVar7) {
    uVar16 = iVar9 + iVar21;
    if ((int)uVar16 < -0x134) {
      dVar25 = 0.0;
      if (-0x269 < (int)uVar16) {
        dVar25 = (dVar24 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar16 - 0x134) * 8);
      }
    }
    else if ((int)uVar16 < 0) {
      dVar25 = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar16 * 8);
    }
    else {
      dVar25 = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar16 * 8);
    }
    if (cVar2 == '-') {
      dVar25 = -dVar25;
    }
    iVar9 = (*((handler->ctx).current_state)->_vptr_BaseState[2])((ulong)(uint)(float)dVar25);
    pBVar14 = (BaseState<false> *)CONCAT44(extraout_var_07,iVar9);
  }
  else if (bVar6) {
    if (cVar2 == '-') {
      iVar9 = (*((handler->ctx).current_state)->_vptr_BaseState[2])
                        ((ulong)(uint)(float)(long)-uVar22);
      pBVar14 = (BaseState<false> *)CONCAT44(extraout_var_04,iVar9);
    }
    else {
      pBVar14 = (handler->ctx).current_state;
      iVar9 = (*pBVar14->_vptr_BaseState[2])((ulong)(uint)(float)uVar22,pBVar14,handler);
      pBVar14 = (BaseState<false> *)CONCAT44(extraout_var_08,iVar9);
    }
  }
  else if (cVar2 == '-') {
    iVar9 = (*((handler->ctx).current_state)->_vptr_BaseState[2])((ulong)(uint)(float)-(int)uVar15);
    pBVar14 = (BaseState<false> *)CONCAT44(extraout_var_05,iVar9);
  }
  else {
    iVar9 = (*((handler->ctx).current_state)->_vptr_BaseState[3])();
    pBVar14 = (BaseState<false> *)CONCAT44(extraout_var_06,iVar9);
  }
  if (pBVar14 != (BaseState<false> *)0x0) {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = pBVar14;
    goto LAB_001db774;
  }
  uVar10 = 0x10;
LAB_001db61d:
  *(undefined4 *)(this + 0x30) = uVar10;
  *(long *)(this + 0x38) = lVar13;
LAB_001db774:
  is->src_ = (Ch *)pbVar11;
  is->dst_ = pCVar3;
  is->head_ = pCVar5;
  return;
}

Assistant:

Ch Peek() { return *src_; }